

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiout.cpp
# Opt level: O0

int anon_unknown.dwarf_16e00::RtMidiOut_getcurrentapi(lua_State *L)

{
  Api AVar1;
  RtMidiOut *this;
  RtMidiOut *self;
  lua_State *L_local;
  
  this = getRtMidiOut(L,1);
  AVar1 = RtMidiOut::getCurrentApi(this);
  lua_pushinteger(L,AVar1);
  return 1;
}

Assistant:

int RtMidiOut_getcurrentapi(lua_State *L) {
	auto &self = getRtMidiOut(L, 1);
	lua_pushinteger(L, self.getCurrentApi());
	return 1;
}